

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

Status __thiscall
leveldb::TableCache::FindTable
          (TableCache *this,uint64_t file_number,uint64_t file_size,Handle **handle)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  uint64_t in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  long *in_R8;
  TableAndFile *tf;
  Table **in_stack_00000030;
  uint64_t in_stack_00000038;
  RandomAccessFile *in_stack_00000040;
  string old_fname;
  Table *table;
  RandomAccessFile *file;
  string fname;
  Slice key;
  char buf [8];
  Status *s;
  Status *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  byte in_stack_ffffffffffffff27;
  string *dbname;
  Status local_a8;
  string local_a0 [32];
  undefined1 local_80 [8];
  undefined8 local_78;
  long *local_70;
  string local_68 [32];
  Slice local_48;
  char local_31 [8];
  undefined1 local_29;
  long *local_28;
  uint64_t local_18;
  
  local_29 = 0;
  dbname = in_RDI;
  local_28 = in_R8;
  local_18 = in_RDX;
  Status::Status((Status *)in_RDI);
  EncodeFixed64(local_31,local_18);
  Slice::Slice(&local_48,local_31,8);
  lVar2 = (**(code **)(*(long *)in_RSI[6] + 0x18))((long *)in_RSI[6],&local_48);
  *local_28 = lVar2;
  if (*local_28 == 0) {
    TableFileName(dbname,CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    local_70 = (long *)0x0;
    local_78 = 0;
    (**(code **)(*(long *)*in_RSI + 0x18))(local_80,(long *)*in_RSI,local_68,&local_70);
    Status::operator=((Status *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff18);
    Status::~Status((Status *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    bVar1 = Status::ok((Status *)dbname);
    if (!bVar1) {
      SSTTableFileName(dbname,CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      (**(code **)(*(long *)*in_RSI + 0x18))(&local_a8,(long *)*in_RSI,local_a0,&local_70);
      in_stack_ffffffffffffff27 = Status::ok(&local_a8);
      Status::~Status((Status *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      if ((in_stack_ffffffffffffff27 & 1) != 0) {
        Status::OK();
        Status::operator=((Status *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                          in_stack_ffffffffffffff18);
        Status::~Status((Status *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      }
      std::__cxx11::string::~string(local_a0);
    }
    bVar1 = Status::ok((Status *)dbname);
    if (bVar1) {
      Table::Open((Options *)old_fname._0_8_,in_stack_00000040,in_stack_00000038,in_stack_00000030);
      Status::operator=((Status *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff18);
      Status::~Status((Status *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    }
    bVar1 = Status::ok((Status *)dbname);
    if (bVar1) {
      puVar3 = (undefined8 *)operator_new(0x10);
      *puVar3 = local_70;
      puVar3[1] = local_78;
      lVar2 = (**(code **)(*(long *)in_RSI[6] + 0x10))
                        ((long *)in_RSI[6],&local_48,puVar3,1,DeleteEntry);
      *local_28 = lVar2;
    }
    else if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
    std::__cxx11::string::~string(local_68);
  }
  return (Status)(char *)in_RDI;
}

Assistant:

Status TableCache::FindTable(uint64_t file_number, uint64_t file_size,
                             Cache::Handle** handle) {
  Status s;
  char buf[sizeof(file_number)];
  EncodeFixed64(buf, file_number);
  Slice key(buf, sizeof(buf));
  *handle = cache_->Lookup(key);
  if (*handle == nullptr) {
    std::string fname = TableFileName(dbname_, file_number);
    RandomAccessFile* file = nullptr;
    Table* table = nullptr;
    s = env_->NewRandomAccessFile(fname, &file);
    if (!s.ok()) {
      std::string old_fname = SSTTableFileName(dbname_, file_number);
      if (env_->NewRandomAccessFile(old_fname, &file).ok()) {
        s = Status::OK();
      }
    }
    if (s.ok()) {
      s = Table::Open(options_, file, file_size, &table);
    }

    if (!s.ok()) {
      assert(table == nullptr);
      delete file;
      // We do not cache error results so that if the error is transient,
      // or somebody repairs the file, we recover automatically.
    } else {
      TableAndFile* tf = new TableAndFile;
      tf->file = file;
      tf->table = table;
      *handle = cache_->Insert(key, tf, 1, &DeleteEntry);
    }
  }
  return s;
}